

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O2

bool __thiscall
cmCTestStartCommand::InitialCheckout(cmCTestStartCommand *this,ostream *ofs,string *sourceDir)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *command;
  cmCTestVC vc;
  allocator local_1a9;
  cmCTestVC local_1a8;
  
  pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  std::__cxx11::string::string((string *)&local_1a8,"CTEST_CHECKOUT_COMMAND",&local_1a9);
  command = cmMakefile::GetDefinition(pcVar1,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (command == (char *)0x0) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&local_1a8,"CTEST_CVS_CHECKOUT",&local_1a9);
    command = cmMakefile::GetDefinition(pcVar1,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (command == (char *)0x0) {
      return true;
    }
  }
  cmCTestVC::cmCTestVC(&local_1a8,(this->super_cmCTestCommand).CTest,ofs);
  cmCTestVC::SetSourceDirectory(&local_1a8,sourceDir);
  bVar2 = cmCTestVC::InitialCheckout(&local_1a8,command);
  cmCTestVC::~cmCTestVC(&local_1a8);
  if (bVar2) {
    return true;
  }
  return false;
}

Assistant:

bool cmCTestStartCommand::InitialCheckout(
  std::ostream& ofs, std::string const& sourceDir)
{
  // Use the user-provided command to create the source tree.
  const char* initialCheckoutCommand
    = this->Makefile->GetDefinition("CTEST_CHECKOUT_COMMAND");
  if(!initialCheckoutCommand)
    {
    initialCheckoutCommand =
      this->Makefile->GetDefinition("CTEST_CVS_CHECKOUT");
    }
  if(initialCheckoutCommand)
    {
    // Use a generic VC object to run and log the command.
    cmCTestVC vc(this->CTest, ofs);
    vc.SetSourceDirectory(sourceDir);
    if(!vc.InitialCheckout(initialCheckoutCommand))
      {
      return false;
      }
    }
  return true;
}